

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.cc
# Opt level: O0

int MaskCpuFlags(int enable_flags)

{
  uint uVar1;
  uint in_EDI;
  int cpu_info;
  
  uVar1 = libyuv::GetCpuFlags();
  libyuv::SetCpuFlags(uVar1 & in_EDI);
  return uVar1 & in_EDI;
}

Assistant:

LIBYUV_API
int MaskCpuFlags(int enable_flags) {
  int cpu_info = GetCpuFlags() & enable_flags;
  SetCpuFlags(cpu_info);
  return cpu_info;
}